

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# relative.cpp
# Opt level: O2

string * fs_proximate_to_abi_cxx11_
                   (string *__return_storage_ptr__,string_view base,string_view other)

{
  string_view path2;
  string_view path1;
  string_view in;
  string_view fname;
  error_code ec;
  string_view other_local;
  string_view base_local;
  string r;
  path local_98;
  path local_70;
  path local_48;
  
  other_local._M_str = other._M_str;
  other_local._M_len = other._M_len;
  base_local._M_str = base._M_str;
  base_local._M_len = base._M_len;
  ec._M_value = 0;
  ec._M_cat = (error_category *)std::_V2::system_category();
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_70,&other_local,auto_format);
  std::filesystem::__cxx11::path::
  path<std::basic_string_view<char,std::char_traits<char>>,std::filesystem::__cxx11::path>
            (&local_98,&base_local,auto_format);
  std::filesystem::proximate(&local_48,&local_70,(error_code *)&local_98);
  std::filesystem::__cxx11::path::generic_string(&r,&local_48);
  std::filesystem::__cxx11::path::~path(&local_48);
  std::filesystem::__cxx11::path::~path(&local_98);
  std::filesystem::__cxx11::path::~path(&local_70);
  if (ec._M_value == 0) {
    in._M_str = r._M_dataplus._M_p;
    in._M_len = r._M_string_length;
    fs_drop_slash_abi_cxx11_(__return_storage_ptr__,in);
  }
  else {
    path1._M_str = base_local._M_str;
    path1._M_len = base_local._M_len;
    path2._M_str = other_local._M_str;
    path2._M_len = other_local._M_len;
    fname._M_str = "fs_proximate_to";
    fname._M_len = 0xf;
    fs_print_error(path1,path2,fname,&ec);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  std::__cxx11::string::~string((string *)&r);
  return __return_storage_ptr__;
}

Assistant:

std::string fs_proximate_to(std::string_view base, std::string_view other)
{
  // find proximate path from base to other
  // "base" and "other" are treated as weakly canonical paths

  std::error_code ec;

#ifdef HAVE_CXX_FILESYSTEM
  std::string r = std::filesystem::proximate(other, base, ec).generic_string();
  if(!ec)
    return fs_drop_slash(r);
#else
   ec = std::make_error_code(std::errc::function_not_supported);
#endif

  fs_print_error(base, other, __func__, ec);
  return {};
}